

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# black_leaf_node.h
# Opt level: O0

void __thiscall compose::BlackLeafNode::BlackLeafNode(BlackLeafNode *this,string *name)

{
  string *name_local;
  BlackLeafNode *this_local;
  
  LeafNode::LeafNode(&this->super_LeafNode);
  (this->super_LeafNode).super_INode._vptr_INode = (_func_int **)&PTR_AddNode_0019e730;
  std::__cxx11::string::operator=
            ((string *)&(this->super_LeafNode).super_INode.name_,(string *)name);
  return;
}

Assistant:

BlackLeafNode::BlackLeafNode(const std::string& name) {
    name_ = name;
}